

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

void sq_newtable(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQObjectPtr local_18;
  
  local_18.super_SQObject._unVal.pTable = SQTable::Create(v->_sharedstate,0);
  local_18.super_SQObject._type = OT_TABLE;
  pSVar1 = &((local_18.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  SQVM::Push(v,&local_18);
  SQObjectPtr::~SQObjectPtr(&local_18);
  return;
}

Assistant:

void sq_newtable(HSQUIRRELVM v)
{
    v->Push(SQTable::Create(_ss(v), 0));
}